

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_DBL *data,REF_INT dim)

{
  int iVar1;
  bool bVar2;
  REF_MPI pRVar3;
  uint uVar4;
  REF_INT *pRVar5;
  undefined4 extraout_var;
  long lVar6;
  REF_INT *pRVar7;
  void *pvVar8;
  REF_STATUS RVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  REF_INT *pRVar20;
  size_t sVar21;
  ulong uVar22;
  REF_STATUS RVar23;
  REF_INT node1;
  REF_INT node0;
  uint local_ac;
  uint local_a8;
  int local_a4;
  REF_INT *local_a0;
  REF_NODE local_98;
  REF_MPI local_90;
  void *local_88;
  ulong local_80;
  REF_INT *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  REF_INT local_58;
  REF_INT local_54;
  int *local_50;
  REF_DBL *local_48;
  long local_40;
  size_t local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  local_98 = ref_edge->node;
  sVar21 = (long)ref_mpi->n << 2;
  local_48 = data;
  pRVar5 = (REF_INT *)malloc(sVar21);
  if (pRVar5 == (REF_INT *)0x0) {
    pRVar20 = (REF_INT *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x1d4,
           "ref_edge_ghost_dbl","malloc a_size of REF_INT NULL");
  }
  else {
    memset(pRVar5,0,sVar21);
    pRVar20 = pRVar5;
  }
  RVar23 = 2;
  if (pRVar5 == (REF_INT *)0x0) {
    return 2;
  }
  iVar11 = ref_mpi->n;
  local_90 = ref_mpi;
  if ((long)iVar11 < 0) {
    bVar2 = false;
    iVar11 = printf("%s: %d: %s: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                    ,0x1d5,"ref_edge_ghost_dbl","malloc b_size of REF_INT negative");
    pRVar5 = (REF_INT *)CONCAT44(extraout_var,iVar11);
    RVar9 = 1;
  }
  else {
    sVar21 = (long)iVar11 * 4;
    pRVar5 = (REF_INT *)malloc(sVar21);
    if (pRVar5 == (REF_INT *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x1d5,
             "ref_edge_ghost_dbl","malloc b_size of REF_INT NULL");
      RVar9 = 2;
      pRVar5 = (REF_INT *)0x0;
    }
    else {
      RVar9 = 2;
      bVar2 = true;
      if (iVar11 != 0) {
        memset(pRVar5,0,sVar21);
        RVar9 = 2;
      }
    }
  }
  if (!bVar2) {
    return RVar9;
  }
  iVar11 = ref_edge->n;
  local_78 = pRVar20;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  else {
    uVar4 = local_90->id;
    iVar15 = 0;
    local_a0 = pRVar5;
    do {
      ref_edge_part(ref_edge,iVar15,(REF_INT *)&local_ac);
      if (local_ac != uVar4) {
        local_78[(int)local_ac] = local_78[(int)local_ac] + 1;
      }
      iVar15 = iVar15 + 1;
      pRVar5 = local_a0;
    } while (iVar11 != iVar15);
  }
  pRVar20 = local_78;
  pRVar3 = local_90;
  local_a4 = iVar11;
  uVar4 = ref_mpi_alltoall(local_90,local_78,pRVar5,1);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x1dd,
           "ref_edge_ghost_dbl",(ulong)uVar4,"alltoall sizes");
    return uVar4;
  }
  uVar4 = pRVar3->n;
  lVar16 = (long)(int)uVar4;
  if (lVar16 < 1) {
    uVar17 = 0;
    local_ac = 0;
  }
  else {
    lVar6 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + pRVar20[lVar6];
      lVar6 = lVar6 + 1;
      local_ac = uVar4;
    } while (lVar16 != lVar6);
  }
  if ((int)uVar17 < 0) {
    pcVar19 = "malloc a_nodes of REF_GLOB negative";
    uVar13 = 0x1e1;
LAB_00176eb9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar13,
           "ref_edge_ghost_dbl",pcVar19);
    RVar23 = 1;
  }
  else {
    pRVar7 = (REF_INT *)malloc((ulong)(uVar17 * 2) << 3);
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar19 = "malloc a_nodes of REF_GLOB NULL";
      uVar13 = 0x1e1;
    }
    else {
      if ((int)(uVar17 * dim) < 0) {
        pcVar19 = "malloc a_data of REF_DBL negative";
        uVar13 = 0x1e2;
        goto LAB_00176eb9;
      }
      local_a0 = pRVar7;
      pvVar8 = malloc((ulong)(uVar17 * dim) << 3);
      if (pvVar8 == (void *)0x0) {
        pcVar19 = "malloc a_data of REF_DBL NULL";
        uVar13 = 0x1e2;
      }
      else {
        local_60 = pvVar8;
        pvVar8 = malloc((ulong)uVar17 << 2);
        if (pvVar8 == (void *)0x0) {
          pcVar19 = "malloc a_edge of REF_INT NULL";
          uVar13 = 0x1e3;
        }
        else {
          if ((int)uVar4 < 1) {
            uVar14 = 0;
            local_ac = 0;
          }
          else {
            lVar6 = 0;
            uVar14 = 0;
            do {
              uVar14 = (ulong)(uint)((int)uVar14 + pRVar5[lVar6]);
              lVar6 = lVar6 + 1;
              local_ac = uVar4;
            } while (lVar16 != lVar6);
          }
          if ((int)uVar14 < 0) {
            pcVar19 = "malloc b_nodes of REF_GLOB negative";
            uVar13 = 0x1e7;
            goto LAB_00176eb9;
          }
          local_80 = uVar14;
          local_68 = pvVar8;
          pvVar8 = malloc((ulong)(uint)((int)uVar14 * 2) << 3);
          if (pvVar8 == (void *)0x0) {
            pcVar19 = "malloc b_nodes of REF_GLOB NULL";
            uVar13 = 0x1e7;
          }
          else {
            uVar10 = (int)local_80 * dim;
            if ((int)uVar10 < 0) {
              pcVar19 = "malloc b_data of REF_DBL negative";
              uVar13 = 0x1e8;
              goto LAB_00176eb9;
            }
            local_88 = pvVar8;
            pvVar8 = malloc((ulong)uVar10 << 3);
            if (pvVar8 == (void *)0x0) {
              pcVar19 = "malloc b_data of REF_DBL NULL";
              uVar13 = 0x1e8;
            }
            else {
              if ((int)uVar4 < 0) {
                pcVar19 = "malloc a_next of REF_INT negative";
                uVar13 = 0x1ea;
                goto LAB_00176eb9;
              }
              local_70 = pvVar8;
              local_50 = (int *)malloc(lVar16 * 4);
              if (local_50 != (int *)0x0) {
                *local_50 = 0;
                lVar6 = 1;
                if (1 < (int)uVar4) {
                  iVar11 = *local_50;
                  lVar6 = 1;
                  do {
                    iVar11 = iVar11 + pRVar20[lVar6 + -1];
                    local_50[lVar6] = iVar11;
                    lVar6 = lVar6 + 1;
                  } while (lVar16 != lVar6);
                }
                local_ac = (uint)lVar6;
                iVar11 = ref_edge->n;
                if ((long)iVar11 < 1) {
                  lVar16 = 0;
                }
                else {
                  local_a8 = local_90->id;
                  lVar16 = 0;
                  do {
                    ref_edge_part(ref_edge,(REF_INT)lVar16,(REF_INT *)&local_ac);
                    if (local_ac != local_a8) {
                      iVar15 = local_50[(int)local_ac];
                      *(REF_INT *)((long)local_68 + (long)iVar15 * 4) = (REF_INT)lVar16;
                      pRVar7 = ref_edge->e2n;
                      iVar1 = pRVar7[lVar16 * 2];
                      lVar12 = -1;
                      lVar6 = -1;
                      if (((-1 < (long)iVar1) && (iVar1 < local_98->max)) &&
                         (lVar6 = local_98->global[iVar1], lVar6 < 0)) {
                        lVar6 = -1;
                      }
                      *(long *)(local_a0 + (long)iVar15 * 4) = lVar6;
                      iVar1 = pRVar7[lVar16 * 2 + 1];
                      if (((-1 < (long)iVar1) && (iVar1 < local_98->max)) &&
                         (lVar12 = local_98->global[iVar1], lVar12 < 0)) {
                        lVar12 = -1;
                      }
                      *(long *)(local_a0 + (long)(int)(iVar15 * 2 | 1) * 2) = lVar12;
                      local_50[(int)local_ac] = iVar15 + 1;
                    }
                    lVar16 = lVar16 + 1;
                  } while (iVar11 != lVar16);
                }
                local_a4 = (int)lVar16;
                uVar4 = ref_mpi_alltoallv(local_90,local_a0,pRVar20,local_88,pRVar5,2,2);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x1fd,"ref_edge_ghost_dbl",(ulong)uVar4,"alltoallv requested nodes");
                  return uVar4;
                }
                if ((int)local_80 != 0) {
                  local_38 = (ulong)(uint)dim << 3;
                  uVar14 = 1;
                  if (1 < (int)local_80) {
                    uVar14 = local_80 & 0xffffffff;
                  }
                  local_80 = uVar14 << 4;
                  local_40 = (long)dim;
                  uVar14 = 0;
                  local_a8 = 0;
                  do {
                    uVar4 = ref_node_local(local_98,*(REF_GLOB *)((long)local_88 + uVar14),&local_54
                                          );
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                             ,0x200,"ref_edge_ghost_dbl",(ulong)uVar4,"loc 0");
                      return uVar4;
                    }
                    uVar4 = ref_node_local(local_98,*(REF_GLOB *)((long)local_88 + uVar14 + 8),
                                           &local_58);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                             ,0x201,"ref_edge_ghost_dbl",(ulong)uVar4,"loc 1");
                      return uVar4;
                    }
                    uVar10 = ref_edge_with(ref_edge,local_54,local_58,&local_a4);
                    uVar4 = local_a8;
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                             ,0x202,"ref_edge_ghost_dbl",(ulong)uVar10,"find edge");
                      return uVar10;
                    }
                    if (0 < dim) {
                      memcpy((void *)((long)local_70 + (ulong)local_a8 * 8),
                             local_48 + local_a4 * local_40,local_38);
                    }
                    local_a8 = uVar4 + dim;
                    uVar14 = uVar14 + 0x10;
                  } while (local_80 != uVar14);
                }
                uVar4 = ref_mpi_alltoallv(local_90,local_70,pRVar5,local_60,pRVar20,dim,3);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x208,"ref_edge_ghost_dbl",(ulong)uVar4,"alltoallv return data");
                  return uVar4;
                }
                if (uVar17 != 0) {
                  uVar14 = 1;
                  if (1 < (int)uVar17) {
                    uVar14 = (ulong)uVar17;
                  }
                  uVar22 = 0;
                  uVar18 = 0;
                  do {
                    if (0 < dim) {
                      memcpy(local_48 + (long)*(int *)((long)local_68 + uVar18 * 4) * (long)dim,
                             (void *)((long)local_60 + uVar22 * 8),(ulong)(uint)dim << 3);
                    }
                    uVar18 = uVar18 + 1;
                    uVar22 = (ulong)(uint)((int)uVar22 + dim);
                  } while (uVar14 != uVar18);
                }
                free(local_50);
                free(local_70);
                free(local_88);
                free(local_68);
                free(local_60);
                free(local_a0);
                if (pRVar5 != (REF_INT *)0x0) {
                  free(pRVar5);
                }
                if (local_78 == (REF_INT *)0x0) {
                  return 0;
                }
                free(local_78);
                return 0;
              }
              pcVar19 = "malloc a_next of REF_INT NULL";
              uVar13 = 0x1ea;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar13,
           "ref_edge_ghost_dbl",pcVar19);
  }
  return RVar23;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                      REF_DBL *data, REF_INT dim) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_DBL *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;
  REF_INT i;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, dim * a_total, REF_DBL);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, dim * b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    for (i = 0; i < dim; i++) b_data[i + dim * request] = data[i + dim * edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, dim,
                        REF_DBL_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    for (i = 0; i < dim; i++)
      data[i + dim * a_edge[request]] = a_data[i + dim * request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}